

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O1

int l_sqlite3_step(lua_State *L)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  
  plVar3 = (long *)checkudata(L,1);
  lVar1 = *plVar3;
  *(lua_State **)(lVar1 + 8) = L;
  *(undefined4 *)(lVar1 + 0x10) = 0;
  iVar2 = sqlite3_step((sqlite3_stmt *)plVar3[1]);
  lua_pushnumber((double)iVar2,L);
  return 1;
}

Assistant:

FUNC( l_sqlite3_step )
{
  Stmt * stmt = checkstmt(L, 1);
  init_callback_usage(L, stmt->db);
  lua_pushnumber(L, sqlite3_step(stmt->stmt) );
  return 1;
}